

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.cpp
# Opt level: O2

double maxBias(vector<int,_std::allocator<int>_> *counts,int reps)

{
  int *piVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM6_Qb;
  
  piVar2 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar5 = ZEXT816(0) << 0x40;
  uVar3 = (uint)((ulong)((long)(counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  uVar4 = 0;
  while ((~((int)uVar3 >> 0x1f) & uVar3) != uVar4) {
    piVar1 = piVar2 + uVar4;
    uVar4 = uVar4 + 1;
    auVar7._0_8_ = (double)*piVar1 / (double)reps;
    auVar7._8_8_ = in_XMM6_Qb;
    auVar7 = vfmadd213sd_fma(auVar7,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar7 = vandpd_avx(auVar7,auVar6);
    auVar5 = vmaxsd_avx(auVar7,auVar5);
  }
  return auVar5._0_8_;
}

Assistant:

double maxBias ( std::vector<int> & counts, int reps )
{
  double worst = 0;

  for(int i = 0; i < (int)counts.size(); i++)
  {
    double c = double(counts[i]) / double(reps);

    double d = fabs(c * 2 - 1);

    if(d > worst)
    {
      worst = d;
    }
  }

  return worst;
}